

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.hpp
# Opt level: O1

Media * __thiscall Analyser::Static::Media::operator+=(Media *this,Media *rhs)

{
  std::
  vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Storage::Disk::Disk>const*,std::vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>>>
            ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
              *)this,(this->disks).
                     super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
             (rhs->disks).
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (rhs->disks).
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Storage::Tape::Tape>const*,std::vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>>>
            ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
              *)&this->tapes,
             (this->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (rhs->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (rhs->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Storage::Cartridge::Cartridge>const*,std::vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>>>
            ((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
              *)&this->cartridges,
             (this->cartridges).
             super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (rhs->cartridges).
             super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (rhs->cartridges).
             super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>const*,std::vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>>>
            ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
              *)&this->mass_storage_devices,
             (this->mass_storage_devices).
             super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (rhs->mass_storage_devices).
             super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (rhs->mass_storage_devices).
             super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return this;
}

Assistant:

Media &operator +=(const Media &rhs) {
		const auto append = [&](auto &destination, auto &source) {
			destination.insert(destination.end(), source.begin(), source.end());
		};

		append(disks, rhs.disks);
		append(tapes, rhs.tapes);
		append(cartridges, rhs.cartridges);
		append(mass_storage_devices, rhs.mass_storage_devices);

		return *this;
	}